

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfile_property.c
# Opt level: O2

int mpt_logfile_get(mpt_logfile *log,mpt_property *pr)

{
  uint8_t uVar1;
  FILE *pFVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  
  if (pr == (mpt_property *)0x0) {
    return 4;
  }
  pcVar4 = pr->name;
  if (pcVar4 == (char *)0x0) {
    if (pr->desc != (char *)0x1) {
      if (pr->desc != (char *)0x0) {
        return -1;
      }
LAB_00117472:
      pr->name = "file";
      pcVar4 = "output file descriptor";
      goto LAB_0011749b;
    }
  }
  else {
    if (*pcVar4 == '\0') {
      pr->name = "logfile";
      pcVar4 = "log message target";
LAB_0011749b:
      pr->desc = pcVar4;
      (pr->val)._type = 4;
      pFVar2 = log->file;
      *(FILE **)pr->_buf = pFVar2;
      (pr->val)._addr = pr->_buf;
      bVar5 = pFVar2 == (FILE *)0x0;
      goto LAB_001174ee;
    }
    iVar3 = strcasecmp(pcVar4,"file");
    if (iVar3 == 0) goto LAB_00117472;
    iVar3 = strcasecmp(pcVar4,"ignore");
    if (iVar3 != 0) {
      return -1;
    }
  }
  pr->name = "ignore";
  pr->desc = "output message filter";
  (pr->val)._type = 0x79;
  uVar1 = log->ignore;
  pr->_buf[0] = uVar1;
  (pr->val)._addr = pr->_buf;
  bVar5 = uVar1 == '\b';
LAB_001174ee:
  return (uint)!bVar5;
}

Assistant:

extern int mpt_logfile_get(const MPT_STRUCT(logfile) *log, MPT_STRUCT(property) *pr)
{
	const char *name;
	intptr_t pos = -1, id;
	
	if (!pr) {
		return MPT_ENUM(TypeFilePtr);
	}
	if (!(name = pr->name)) {
		pos = (intptr_t) pr->desc;
	}
	else if (!*name) {
		pr->name = "logfile";
		pr->desc = MPT_tr("log message target");
		MPT_property_set_data(pr, MPT_ENUM(TypeFilePtr), &log->file);
		return log->file ? 1 : 0;
	}
	id = 0;
	if (name ? (!strcasecmp(name, "file")) : pos == id++) {
		pr->name = "file";
		pr->desc = MPT_tr("output file descriptor");
		MPT_property_set_data(pr, MPT_ENUM(TypeFilePtr), &log->file);
		return log->file ? 1 : 0;
	}
	if (name ? !strcasecmp(name, "ignore") : pos == id++) {
		pr->name = "ignore";
		pr->desc = MPT_tr("output message filter");
		MPT_property_set_data(pr, 'y', &log->ignore);
		return log->ignore != MPT_LOG(Info) ? 1 : 0;
	}
	return MPT_ERROR(BadArgument);
}